

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CommandLine.cpp
# Opt level: O0

string * __thiscall
slang::CommandLine::Option::set_abi_cxx11_
          (Option *this,optional<bool> *target,string_view name,string_view value)

{
  string_view name_00;
  _Optional_base<bool,_true,_true> _Var1;
  _Optional_base<bool,_true,_true> *in_RDX;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RDI;
  string *in_stack_00000040;
  undefined1 in_stack_00000048 [16];
  size_t in_stack_00000058;
  string *error;
  
  std::__cxx11::string::string(in_RDI);
  name_00._M_str = (char *)target;
  name_00._M_len = in_stack_00000058;
  _Var1._M_payload.super__Optional_payload_base<bool> =
       (_Optional_payload<bool,_true,_true,_true>)
       parseBool(name_00,(string_view)in_stack_00000048,in_stack_00000040);
  in_RDX->_M_payload = _Var1._M_payload.super__Optional_payload_base<bool>;
  return in_RDI;
}

Assistant:

std::string CommandLine::Option::set(std::optional<bool>& target, std::string_view name,
                                     std::string_view value) {
    std::string error;
    target = parseBool(name, value, error);
    return error;
}